

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bool fmt::v11::detail::write_loc(appender out,loc_value value,format_specs *specs,locale_ref loc)

{
  bool bVar1;
  undefined1 uVar2;
  format_facet<std::locale> *pfVar3;
  locale locale;
  locale local_90 [8];
  undefined **local_88 [2];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale(local_90);
  }
  else {
    std::locale::locale(local_90,(locale *)loc.locale_);
  }
  bVar1 = std::has_facet<fmt::v11::format_facet<std::locale>>(local_90);
  if (bVar1) {
    pfVar3 = std::use_facet<fmt::v11::format_facet<std::locale>>(local_90);
    uVar2 = (**(code **)(*(long *)pfVar3 + 0x10))(pfVar3,out.container,specs);
  }
  else {
    format_facet<std::locale>::format_facet((format_facet<std::locale> *)local_88,local_90);
    uVar2 = (*(code *)local_88[0][2])((format_facet<std::locale> *)local_88,out.container,specs);
    local_88[0] = &PTR__format_facet_0017f810;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((format_facet<std::locale> *)local_88)->decimal_point_ + 0x10U)) {
      operator_delete(local_38._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((format_facet<std::locale> *)local_88)->grouping_ + 0x10U)) {
      operator_delete(local_58._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((format_facet<std::locale> *)local_88)->separator_ + 0x10U)) {
      operator_delete(local_78._M_p);
    }
    std::locale::facet::~facet((facet *)local_88);
  }
  std::locale::~locale(local_90);
  return (bool)uVar2;
}

Assistant:

FMT_FUNC auto write_loc(appender out, loc_value value,
                        const format_specs& specs, locale_ref loc) -> bool {
  auto locale = loc.get<std::locale>();
  // We cannot use the num_put<char> facet because it may produce output in
  // a wrong encoding.
  using facet = format_facet<std::locale>;
  if (std::has_facet<facet>(locale))
    return use_facet<facet>(locale).put(out, value, specs);
  return facet(locale).put(out, value, specs);
}